

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

_Bool target_sighted(void)

{
  loc grid;
  _Bool _Var1;
  monster *mon;
  
  _Var1 = target_okay();
  if ((!_Var1) || (_Var1 = panel_contains(target.grid.y,target.grid.x), !_Var1)) {
    return false;
  }
  if (target.midx == 0) {
    grid.y = target.grid.y;
    grid.x = target.grid.x;
    _Var1 = square_isseen(cave,grid);
    if (_Var1) {
      return true;
    }
    if (target.midx == 0) {
      return false;
    }
  }
  mon = cave_monster(cave,target.midx);
  _Var1 = monster_is_visible(mon);
  return _Var1;
}

Assistant:

bool target_sighted(void)
{
	return target_okay() &&
			panel_contains(target.grid.y, target.grid.x) &&
			 /* either the target is a grid and is visible, or it is a monster
			  * that is visible */
		((!target.midx && square_isseen(cave, target.grid)) ||
		 (target.midx && monster_is_visible(cave_monster(cave, target.midx))));
}